

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

double try_to_double(string *s)

{
  ulong uVar1;
  char *pcVar2;
  double dVar3;
  anon_union_8_2_7f9ece9b v;
  string *s_local;
  
  uVar1 = std::__cxx11::string::length();
  if (((2 < uVar1) && (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)s), *pcVar2 == '0'))
     && ((pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)s), *pcVar2 == 'x' ||
         (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)s), *pcVar2 == 'X')))) {
    dVar3 = (double)std::__cxx11::stoull(s,(size_t *)0x0,0x10);
    return dVar3;
  }
  dVar3 = std::__cxx11::stod(s,(size_t *)0x0);
  return dVar3;
}

Assistant:

inline double try_to_double(std::string s) {
    if (s.length() > 2 && s[0] == '0' && (s[1] == 'x' || s[1] == 'X')) {
        union {
            double d;
            std::uint64_t ll;
        } v;
        v.ll = static_cast<std::uint64_t>(std::stoull(s, 0, 16));
        return v.d;
    }
    else {
        return std::stod(s, 0);
    }
}